

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

ON_SubDMeshFragmentGrid *
ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity
          (ON_SubDMeshFragmentGrid *__return_storage_ptr__,uint display_density,
          uint mesh_density_reduction)

{
  uchar *sides;
  ON_SubDMeshFragmentGrid *pOVar1;
  uint *puVar2;
  uint *puVar3;
  uchar *puVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  unsigned_short uVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  ON__UINT16 OVar12;
  ON__UINT32 OVar13;
  undefined2 uVar14;
  undefined4 uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  bool bVar18;
  uint uVar19;
  uint uVar20;
  ON_SubDMeshFragmentGrid *pOVar21;
  long lVar22;
  ON_SubDMeshFragmentGrid *pOVar23;
  ulong uVar24;
  ON_SubDMeshFragmentGrid *pOVar25;
  long lVar26;
  uint uVar27;
  ON_SubDMeshFragmentGrid *pOVar28;
  ON_SubDMeshFragmentGrid *pOVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  ON_SubDMeshFragmentGrid *pOVar34;
  ON_SubDMeshFragmentGrid *quads;
  uint uVar35;
  ulong uVar36;
  bool bVar37;
  ON_MemoryAllocationTracking disable_tracking;
  
  if (display_density < 9) {
    pOVar1 = QuadGridFromDisplayDensity::grid_cache[display_density];
    if (QuadGridFromDisplayDensity::grid_cache[display_density] == (ON_SubDMeshFragmentGrid *)0x0) {
      bVar18 = ON_SleepLock::GetLock(&QuadGridFromDisplayDensity::lock,0x32,60000,true);
      pOVar1 = QuadGridFromDisplayDensity::grid_cache[display_density];
      if (pOVar1 == (ON_SubDMeshFragmentGrid *)0x0) {
        uVar36 = 0;
        ON_MemoryAllocationTracking::ON_MemoryAllocationTracking(&disable_tracking,false);
        uVar19 = 4;
        if (4 < display_density) {
          uVar19 = display_density;
        }
        uVar30 = (ulong)display_density;
        if (4 >= display_density) {
          uVar30 = uVar36;
        }
        if (uVar19 < (uint)uVar30) {
          lVar22 = 0;
          uVar24 = 0;
          lVar26 = 0;
        }
        else {
          iVar32 = 0;
          uVar27 = 0;
          uVar24 = uVar30;
          do {
            uVar20 = 1 << ((byte)uVar24 & 0x1f);
            do {
              if (0xffffffbf < uVar20 - 0x41) {
                uVar35 = 1;
                do {
                  if (uVar35 == uVar20) {
                    iVar31 = uVar20 * uVar20;
                    goto LAB_00606c8b;
                  }
                  uVar35 = uVar35 * 2;
                } while (uVar35 <= uVar20);
              }
              iVar31 = 0;
              ON_SubDIncrementErrorCount();
LAB_00606c8b:
              uVar35 = (int)uVar36 + iVar31;
              uVar36 = (ulong)uVar35;
              iVar32 = iVar32 + uVar20 * 4 + 1;
              uVar27 = uVar27 + 1;
              bVar37 = 1 < uVar20;
              uVar20 = uVar20 >> 1;
            } while (bVar37);
            uVar20 = (int)uVar24 + 1;
            uVar24 = (ulong)uVar20;
          } while (uVar20 <= uVar19);
          uVar36 = (ulong)(iVar32 + uVar35 * 4);
          uVar24 = (ulong)uVar27;
          lVar22 = uVar24 * 0x30;
          if ((uVar36 * -0x5555555555555554 >> 4 | uVar36 * -0x5555555555555554 << 0x3c) <
              0x555555555555556) {
            lVar26 = uVar36 * 4;
          }
          else {
            lVar26 = (uVar36 / 0xc) * 0x30 + 0x30;
          }
        }
        pOVar23 = (ON_SubDMeshFragmentGrid *)
                  operator_new__(((ulong)(lVar22 + lVar26) / 3 & 0xfffffffffffffff0) * 3,
                                 (nothrow_t *)&std::nothrow);
        pOVar21 = Empty.m_next_level_of_detail;
        pOVar1 = Empty.m_prev_level_of_detail;
        uVar16 = Empty.m_reserved5._2_2_;
        uVar15 = Empty._10_4_;
        uVar5 = Empty.m_reserved3;
        uVar14 = Empty._0_2_;
        pOVar34 = pOVar23 + uVar24;
        puVar4 = &pOVar34->m_reserved1;
        for (; (uint)uVar30 <= uVar19; uVar30 = (ulong)((uint)uVar30 + 1)) {
          uVar20 = 1 << ((byte)uVar30 & 0x1f);
          uVar35 = 0;
          pOVar28 = (ON_SubDMeshFragmentGrid *)0x0;
          pOVar29 = pOVar23;
          quads = pOVar34;
          uVar27 = uVar20;
          do {
            if (0xffffffbf < uVar27 - 0x41) {
              uVar33 = 1;
              do {
                if (uVar33 == uVar27) {
                  uVar33 = uVar27 * uVar27;
                  goto LAB_00606dd5;
                }
                uVar33 = uVar33 * 2;
              } while (uVar33 <= uVar27);
            }
            uVar33 = 0;
            ON_SubDIncrementErrorCount();
LAB_00606dd5:
            uVar24 = (ulong)(uVar27 * 4 + 1);
            sides = &quads->m_reserved1 + (ulong)(uVar33 * 4) * 4;
            pOVar34 = (ON_SubDMeshFragmentGrid *)(sides + uVar24 * 4);
            if ((ON_SubDMeshFragmentGrid *)(puVar4 + uVar36 * 4) < pOVar34) {
              ON_SubDIncrementErrorCount();
              pOVar25 = pOVar29;
              break;
            }
            SetQuads(uVar20,uVar35,(uint *)quads,(ulong)uVar33,4,(uint *)sides,uVar24,1);
            uVar17 = Empty._0_2_;
            Empty.m_reserved1 = (uchar)uVar14;
            Empty.m_reserved2 = SUB21(uVar14,1);
            uVar6 = Empty.m_reserved2;
            pOVar29->m_reserved1 = Empty.m_reserved1;
            Empty._0_2_ = uVar17;
            pOVar29->m_reserved2 = uVar6;
            pOVar29->m_side_segment_count = (uchar)uVar27;
            pOVar29->m_reserved3 = uVar5;
            pOVar29->m_F_count = (unsigned_short)uVar33;
            pOVar29->m_F_level_of_detail = (unsigned_short)uVar35;
            pOVar29->m_F_stride = 4;
            *(undefined4 *)&pOVar29->m_reserved4 = uVar15;
            *(undefined2 *)((long)&pOVar29->m_reserved5 + 2) = uVar16;
            pOVar29->m_F = (uint *)quads;
            pOVar29->m_S = (uint *)sides;
            pOVar29->m_prev_level_of_detail = pOVar1;
            pOVar29->m_next_level_of_detail = pOVar21;
            if (pOVar28 != (ON_SubDMeshFragmentGrid *)0x0) {
              pOVar29->m_prev_level_of_detail = pOVar28;
              pOVar28->m_next_level_of_detail = pOVar29;
            }
            uVar35 = uVar35 + 1;
            pOVar25 = pOVar29 + 1;
            bVar37 = 1 < uVar27;
            pOVar28 = pOVar29;
            pOVar29 = pOVar25;
            quads = pOVar34;
            uVar27 = uVar27 >> 1;
          } while (bVar37);
          QuadGridFromDisplayDensity::grid_cache[uVar30] = pOVar23;
          pOVar23 = pOVar25;
        }
        if (bVar18) {
          ON_SleepLock::ReturnLock(&QuadGridFromDisplayDensity::lock);
        }
        if (pOVar34 != (ON_SubDMeshFragmentGrid *)(puVar4 + uVar36 * 4)) {
          ON_SubDIncrementErrorCount();
        }
        pOVar1 = QuadGridFromDisplayDensity::grid_cache[display_density];
        if (QuadGridFromDisplayDensity::grid_cache[display_density] ==
            (ON_SubDMeshFragmentGrid *)0x0) {
          ON_SubDIncrementErrorCount();
          pOVar21 = &Empty;
        }
        else {
          do {
            pOVar21 = pOVar1;
            if (mesh_density_reduction <= pOVar21->m_F_level_of_detail) break;
            pOVar1 = pOVar21->m_next_level_of_detail;
          } while (pOVar21->m_next_level_of_detail != (ON_SubDMeshFragmentGrid *)0x0);
        }
        uVar5 = pOVar21->m_reserved1;
        uVar6 = pOVar21->m_reserved2;
        uVar7 = pOVar21->m_side_segment_count;
        uVar8 = pOVar21->m_reserved3;
        uVar9 = pOVar21->m_F_count;
        uVar10 = pOVar21->m_F_level_of_detail;
        uVar11 = pOVar21->m_F_stride;
        OVar12 = pOVar21->m_reserved4;
        OVar13 = pOVar21->m_reserved5;
        puVar2 = pOVar21->m_F;
        puVar3 = pOVar21->m_S;
        pOVar1 = pOVar21->m_next_level_of_detail;
        __return_storage_ptr__->m_prev_level_of_detail = pOVar21->m_prev_level_of_detail;
        __return_storage_ptr__->m_next_level_of_detail = pOVar1;
        __return_storage_ptr__->m_F = puVar2;
        __return_storage_ptr__->m_S = puVar3;
        __return_storage_ptr__->m_reserved1 = uVar5;
        __return_storage_ptr__->m_reserved2 = uVar6;
        __return_storage_ptr__->m_side_segment_count = uVar7;
        __return_storage_ptr__->m_reserved3 = uVar8;
        __return_storage_ptr__->m_F_count = uVar9;
        __return_storage_ptr__->m_F_level_of_detail = uVar10;
        __return_storage_ptr__->m_F_stride = uVar11;
        __return_storage_ptr__->m_reserved4 = OVar12;
        __return_storage_ptr__->m_reserved5 = OVar13;
        ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking(&disable_tracking);
        return __return_storage_ptr__;
      }
      ON_SleepLock::ReturnLock(&QuadGridFromDisplayDensity::lock);
      do {
        pOVar21 = pOVar1;
        if (mesh_density_reduction <= pOVar21->m_F_level_of_detail) break;
        pOVar1 = pOVar21->m_next_level_of_detail;
      } while (pOVar21->m_next_level_of_detail != (ON_SubDMeshFragmentGrid *)0x0);
    }
    else {
      do {
        pOVar21 = pOVar1;
        if (mesh_density_reduction <= pOVar21->m_F_level_of_detail) break;
        pOVar1 = pOVar21->m_next_level_of_detail;
      } while (pOVar21->m_next_level_of_detail != (ON_SubDMeshFragmentGrid *)0x0);
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    pOVar21 = &Empty;
  }
  uVar5 = pOVar21->m_reserved1;
  uVar6 = pOVar21->m_reserved2;
  uVar7 = pOVar21->m_side_segment_count;
  uVar8 = pOVar21->m_reserved3;
  uVar9 = pOVar21->m_F_count;
  uVar10 = pOVar21->m_F_level_of_detail;
  uVar11 = pOVar21->m_F_stride;
  OVar12 = pOVar21->m_reserved4;
  OVar13 = pOVar21->m_reserved5;
  puVar2 = pOVar21->m_F;
  puVar3 = pOVar21->m_S;
  pOVar1 = pOVar21->m_next_level_of_detail;
  __return_storage_ptr__->m_prev_level_of_detail = pOVar21->m_prev_level_of_detail;
  __return_storage_ptr__->m_next_level_of_detail = pOVar1;
  __return_storage_ptr__->m_F = puVar2;
  __return_storage_ptr__->m_S = puVar3;
  __return_storage_ptr__->m_reserved1 = uVar5;
  __return_storage_ptr__->m_reserved2 = uVar6;
  __return_storage_ptr__->m_side_segment_count = uVar7;
  __return_storage_ptr__->m_reserved3 = uVar8;
  __return_storage_ptr__->m_F_count = uVar9;
  __return_storage_ptr__->m_F_level_of_detail = uVar10;
  __return_storage_ptr__->m_F_stride = uVar11;
  __return_storage_ptr__->m_reserved4 = OVar12;
  __return_storage_ptr__->m_reserved5 = OVar13;
  return __return_storage_ptr__;
}

Assistant:

ON_SubDMeshFragmentGrid ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(
  unsigned int display_density,
  unsigned int mesh_density_reduction
  )
{
  static const ON_SubDMeshFragmentGrid* grid_cache[9] = { 0 }; // side_segment_count = 1,2,4,8,16,32,64,128,256

  if ( ((size_t)display_density) >= sizeof(grid_cache)/sizeof(grid_cache[0]))
    return ON_SUBD_RETURN_ERROR(ON_SubDMeshFragmentGrid::Empty);

  const ON_SubDMeshFragmentGrid* fragment_grid = grid_cache[display_density];
  if (nullptr != fragment_grid)
  {
    while ( fragment_grid->m_F_level_of_detail < mesh_density_reduction && nullptr != fragment_grid->m_next_level_of_detail)
      fragment_grid = fragment_grid->m_next_level_of_detail;
    return *fragment_grid;
  }

  // The code below is thread safe and constructs the ON_SubDLimitMeshFragmentGrids
  // that are resources shared by all ON_SubDLimitMeshFragments.

  static ON_SleepLock lock;
  const bool bReturnLock = lock.GetLock(50,ON_SleepLock::OneMinute,true);

  // try again in case cache was made while waiting
  fragment_grid = grid_cache[display_density];
  if (nullptr != fragment_grid)
  {
    lock.ReturnLock();
    while ( fragment_grid->m_F_level_of_detail < mesh_density_reduction && nullptr != fragment_grid->m_next_level_of_detail)
      fragment_grid = fragment_grid->m_next_level_of_detail;
    return *fragment_grid;
  }

  // The ON_SubDMeshFragmentGrid classes created below are created one time as needed
  // and used millions of times after that. These are app workspace allocations
  // and not memory leaks. Once a grid exists, it is saved in grid_cache[] and returned
  // above the next zillion times it is required.
  ON_MemoryAllocationTracking disable_tracking(false);

  // make the requested grid
  unsigned int quad_capacity = 0;
  unsigned int side_segment_capacity = 0;
  unsigned int grid_count = 0;
  unsigned int grid_cache_index0 = display_density;
  unsigned int grid_cache_index1 = display_density;
  if (display_density <= ON_SubDDisplayParameters::DefaultDensity)
  {
    // make all the common small grids
    grid_cache_index0 = 0;
    grid_cache_index1 = ON_SubDDisplayParameters::DefaultDensity;
  }
  for (unsigned int i = grid_cache_index0; i <= grid_cache_index1; i++)
  {
    // allocate all levels of detail for each segment side count
    unsigned int s1 = (1U << i);
    for (unsigned int s2 = s1; s2 > 0; s2 /= 2)
    {
      quad_capacity += ON_SubDMeshFragment::QuadGridQuadCountFromSideCount(s2);
      side_segment_capacity += 4*s2 + 1;
      grid_count++;
    }
  }


  const unsigned int vdex_capacity = (quad_capacity*4 + side_segment_capacity);
  size_t sz1 = grid_count*sizeof(ON_SubDMeshFragmentGrid);
  size_t sz2 = vdex_capacity*sizeof(unsigned int);
  if (0 != sz2 % sizeof(ON_SubDMeshFragmentGrid))
    sz2 = (1 + sz2/sizeof(ON_SubDMeshFragmentGrid))*sizeof(ON_SubDMeshFragmentGrid);
  ON_SubDMeshFragmentGrid* grids = new (std::nothrow) ON_SubDMeshFragmentGrid[(sz1 + sz2)/sizeof(ON_SubDMeshFragmentGrid)];

  ON_SubDMeshFragmentGrid grid = ON_SubDMeshFragmentGrid::Empty;
  grid.m_F_stride = 4;
  unsigned int* vdex0 = (unsigned int*)(grids + grid_count);
  unsigned int* vdex1 = vdex0 + vdex_capacity;
  unsigned int* vdex = vdex0;

  for (unsigned int i = grid_cache_index0; i <= grid_cache_index1; i++)
  {
    const unsigned int s1 = (1U << i);
    ON_SubDMeshFragmentGrid* first_lod = grids;
    ON_SubDMeshFragmentGrid* prev_lod = nullptr;
    grid.m_F_level_of_detail = 0;
    for (unsigned int s2 = s1; s2 > 0; s2 /= 2, grids++)
    {
      const unsigned int grid_F_capacity = ON_SubDMeshFragment::QuadGridQuadCountFromSideCount(s2);
      const unsigned int grid_S_capacity = 4*s2 + 1;

      grid.m_side_segment_count = (unsigned char)s2;
      grid.m_F_count = (unsigned short)grid_F_capacity;
      grid.m_F = vdex;
      vdex += 4*grid_F_capacity;
      grid.m_S = vdex;
      vdex += grid_S_capacity;

      if (vdex > vdex1)
      {
        ON_SubDIncrementErrorCount();
        break;
      }

      ON_SubDMeshFragmentGrid::SetQuads(
        s1, // top level side_segment_count
        grid.m_F_level_of_detail,
        const_cast<unsigned int*>(grid.m_F),
        grid_F_capacity,
        grid.m_F_stride,
        const_cast<unsigned int*>(grid.m_S),
        grid_S_capacity,
        1U
        );

      *grids = grid;
      if ( nullptr != prev_lod )
      {
        grids->m_prev_level_of_detail = prev_lod;
        prev_lod->m_next_level_of_detail = grids;
      }
      prev_lod = grids;

      grid.m_F += (grid.m_F_count*grid.m_F_stride);
      grid.m_F_level_of_detail++;
    }

    // Do not initialize grid_cache[i] until entire linked list is ready to be used.
    // This way if the lock is stolen for some unforeseen reason, we risk leaking memory
    // but we will not crash.
    grid_cache[i] = first_lod;
  }

  if ( bReturnLock )
    lock.ReturnLock();

  if (vdex != vdex1)
  {
    ON_SubDIncrementErrorCount();
  }

  fragment_grid = grid_cache[display_density];
  if (nullptr != fragment_grid)
  {
    while ( fragment_grid->m_F_level_of_detail < mesh_density_reduction && nullptr != fragment_grid->m_next_level_of_detail)
      fragment_grid = fragment_grid->m_next_level_of_detail;
    return *fragment_grid;
  }

  return ON_SUBD_RETURN_ERROR(ON_SubDMeshFragmentGrid::Empty);
}